

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping>::moveAppend
          (QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping> *this,
          SeparateToCombinedImageSamplerMapping *b,SeparateToCombinedImageSamplerMapping *e)

{
  SeparateToCombinedImageSamplerMapping *pSVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  int iVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size;
    do {
      pDVar2 = (b->combinedSamplerName).d.d;
      (b->combinedSamplerName).d.d = (Data *)0x0;
      pSVar1[qVar6].combinedSamplerName.d.d = pDVar2;
      pcVar3 = (b->combinedSamplerName).d.ptr;
      (b->combinedSamplerName).d.ptr = (char *)0x0;
      pSVar1[qVar6].combinedSamplerName.d.ptr = pcVar3;
      qVar4 = (b->combinedSamplerName).d.size;
      (b->combinedSamplerName).d.size = 0;
      pSVar1[qVar6].combinedSamplerName.d.size = qVar4;
      iVar5 = b->samplerBinding;
      pSVar1[qVar6].textureBinding = b->textureBinding;
      pSVar1[qVar6].samplerBinding = iVar5;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size +
              1;
      (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }